

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_test.cc
# Opt level: O0

void __thiscall
fizplex::LPTest_AddLogicals_Test::LPTest_AddLogicals_Test(LPTest_AddLogicals_Test *this)

{
  Test *in_RDI;
  
  testing::Test::Test(in_RDI);
  in_RDI->_vptr_Test = (_func_int **)&PTR__LPTest_AddLogicals_Test_0026c118;
  return;
}

Assistant:

TEST(LPTest, AddLogicals) {
  LP lp;
  lp.add_column(ColType::Bounded, 0, 5);
  lp.add_row(RowType::Equality, 1, 1);
  lp.add_row(RowType::Range, 3, 15);
  lp.add_row(RowType::LE, -inf, 7);
  lp.add_row(RowType::NonBinding, -inf, inf);
  lp.add_row(RowType::GE, 3, inf);
  lp.add_logicals();

  EXPECT_TRUE(lp.column_count() == 6);

  EXPECT_EQ(lp.column_header(1).type, ColType::Fixed);
  EXPECT_EQ(lp.column_header(2).type, ColType::Bounded);
  EXPECT_EQ(lp.column_header(3).type, ColType::LowerBound);
  EXPECT_EQ(lp.column_header(4).type, ColType::Free);
  EXPECT_EQ(lp.column_header(5).type, ColType::UpperBound);

  EXPECT_DOUBLE_EQ(0.0, lp.column_header(1).lower);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(1).upper);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(2).lower);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(3).lower);
  EXPECT_DOUBLE_EQ(0.0, lp.column_header(5).upper);
  EXPECT_DOUBLE_EQ(12.0, lp.column_header(2).upper);

  for (int i = 0; i < 5; i++)
    EXPECT_DOUBLE_EQ(1.0, lp.get_value(i, 1 + i));
}